

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_ManPrintBoxInfo(Au_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Au_Ntk_t *pAVar4;
  Au_Obj_t *p_01;
  Au_Ntk_t *Entry;
  char *pcVar5;
  int local_40;
  int Num;
  int k;
  int i;
  Vec_Int_t *vCounts;
  Au_Obj_t *pObj;
  Au_Ntk_t *pBoxModel;
  Au_Ntk_t *pModel;
  Vec_Ptr_t *vMods;
  Au_Ntk_t *pNtk_local;
  
  if (pNtk->pMan == (Au_Man_t *)0x0) {
    printf("There is no hierarchy information.\n");
  }
  else {
    p = &pNtk->pMan->vNtks;
    iVar1 = Vec_PtrSize(p);
    p_00 = Vec_IntStart(iVar1);
    for (Num = 1; iVar1 = Vec_PtrSize(p), Num < iVar1; Num = Num + 1) {
      pAVar4 = (Au_Ntk_t *)Vec_PtrEntry(p,Num);
      iVar1 = Au_NtkBoxNum(pAVar4);
      if (iVar1 != 0) {
        iVar1 = Vec_IntSize(p_00);
        Vec_IntFill(p_00,iVar1,0);
        for (local_40 = 0; iVar1 = Vec_IntSize(&pAVar4->vObjs), local_40 < iVar1;
            local_40 = local_40 + 1) {
          p_01 = Au_NtkObjI(pAVar4,local_40);
          iVar1 = Au_ObjIsBox(p_01);
          if (((iVar1 != 0) && (Entry = Au_ObjModel(p_01), Entry != (Au_Ntk_t *)0x0)) &&
             (Entry != pAVar4)) {
            iVar1 = Vec_PtrFind(p,Entry);
            if ((iVar1 < 0) || (iVar2 = Vec_PtrSize(p), iVar2 <= iVar1)) {
              __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                            ,0x24c,"void Au_ManPrintBoxInfo(Au_Ntk_t *)");
            }
            Vec_IntAddToEntry(p_00,iVar1,1);
          }
        }
        printf("MODULE  ");
        pcVar5 = Au_NtkName(pAVar4);
        printf("%-30s : ",pcVar5);
        uVar3 = Au_NtkPiNum(pAVar4);
        printf("PI=%6d ",(ulong)uVar3);
        uVar3 = Au_NtkPoNum(pAVar4);
        printf("PO=%6d ",(ulong)uVar3);
        uVar3 = Au_NtkBoxNum(pAVar4);
        printf("BB=%6d ",(ulong)uVar3);
        uVar3 = Au_NtkNodeNum(pAVar4);
        printf("ND=%6d ",(ulong)uVar3);
        printf("\n");
        for (local_40 = 0; iVar1 = Vec_IntSize(p_00), local_40 < iVar1; local_40 = local_40 + 1) {
          uVar3 = Vec_IntEntry(p_00,local_40);
          if (uVar3 != 0) {
            pAVar4 = (Au_Ntk_t *)Vec_PtrEntry(p,local_40);
            pcVar5 = Au_NtkName(pAVar4);
            printf("%15d : %s\n",(ulong)uVar3,pcVar5);
          }
        }
      }
    }
    Vec_IntFree(p_00);
    for (Num = 1; iVar1 = Vec_PtrSize(p), Num < iVar1; Num = Num + 1) {
      pAVar4 = (Au_Ntk_t *)Vec_PtrEntry(p,Num);
      iVar1 = Au_NtkBoxNum(pAVar4);
      if (iVar1 == 0) {
        printf("MODULE  ");
        pcVar5 = Au_NtkName(pAVar4);
        printf("%-30s : ",pcVar5);
        uVar3 = Au_NtkPiNum(pAVar4);
        printf("PI=%6d ",(ulong)uVar3);
        uVar3 = Au_NtkPoNum(pAVar4);
        printf("PO=%6d ",(ulong)uVar3);
        uVar3 = Au_NtkBoxNum(pAVar4);
        printf("BB=%6d ",(ulong)uVar3);
        uVar3 = Au_NtkNodeNum(pAVar4);
        printf("ND=%6d ",(ulong)uVar3);
        printf("\n");
      }
    }
  }
  return;
}

Assistant:

void Au_ManPrintBoxInfo( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Au_Ntk_t * pModel, * pBoxModel;
    Au_Obj_t * pObj;
    Vec_Int_t * vCounts;
    int i, k, Num;
    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return;
    }
    vMods = &pNtk->pMan->vNtks;

/*
    vMods->nSize--;
    vMods->pArray++;
    // sort models by name
    Vec_PtrSort( vMods, (int(*)())Au_NtkCompareNames );
    // swap the first model
    Num = Vec_PtrFind( vMods, pNtk );
    assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
    pBoxModel = (Au_Ntk_t *)Vec_PtrEntry(vMods, 0);
    Vec_PtrWriteEntry(vMods, 0, (Au_Ntk_t *)Vec_PtrEntry(vMods, Num) );
    Vec_PtrWriteEntry(vMods, Num, pBoxModel );
    vMods->pArray--;
    vMods->nSize++;
*/

//    Vec_PtrForEachEntry( Au_Ntk_t *, vMods, pModel, i )
//        printf( "%s\n", Au_NtkName(pModel) );

    // print models
    vCounts = Vec_IntStart( Vec_PtrSize(vMods) );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        if ( Au_NtkBoxNum(pModel) == 0 )
            continue;
        Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
        Au_NtkForEachBox( pModel, pObj, k )
        {
            pBoxModel = Au_ObjModel(pObj);
            if ( pBoxModel == NULL || pBoxModel == pModel )
                continue;
            Num = Vec_PtrFind( vMods, pBoxModel );
            assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
            Vec_IntAddToEntry( vCounts, Num, 1 );
        }

//        Au_NtkPrintStats( pModel, 0, 0, 0, 0, 0, 0, 0 );
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) ); // sans constants
//        printf( "Lev=%5d ", Au_NtkLevel(pModel) );
        printf( "\n" );

        Vec_IntForEachEntry( vCounts, Num, k )
            if ( Num )
                printf( "%15d : %s\n", Num, Au_NtkName((Au_Ntk_t *)Vec_PtrEntry(vMods, k)) );
    }
    Vec_IntFree( vCounts );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        if ( Au_NtkBoxNum(pModel) != 0 )
            continue;
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) );
//        printf( "Lev=%5d ", Au_NtkLevel(pModel) );
        printf( "\n" );
    }
}